

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator::GenerateBuilderParsingCode
          (RepeatedImmutableMessageFieldGenerator *this,Printer *printer)

{
  Printer *this_00;
  Type TVar1;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  RepeatedImmutableMessageFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  TVar1 = GetType((this->super_ImmutableMessageFieldGenerator).descriptor_);
  this_00 = local_18;
  if (TVar1 == TYPE_GROUP) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,
               "$type$ m =\n    input.readGroup($number$,\n        $type$.$get_parser$,\n        extensionRegistry);\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (this_00,&(this->super_ImmutableMessageFieldGenerator).variables_,local_28);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,
               "$type$ m =\n    input.readMessage(\n        $type$.$get_parser$,\n        extensionRegistry);\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (this_00,&(this->super_ImmutableMessageFieldGenerator).variables_,local_38);
  }
  (*(this->super_ImmutableMessageFieldGenerator).super_ImmutableFieldGenerator.super_FieldGenerator.
    _vptr_FieldGenerator[0x15])
            (this,local_18,"ensure$capitalized_name$IsMutable();\n$name$_.add(m);\n",
             "$name$Builder_.addMessage(m);\n");
  return;
}

Assistant:

void RepeatedImmutableMessageFieldGenerator::GenerateBuilderParsingCode(
    io::Printer* printer) const {
  if (GetType(descriptor_) == FieldDescriptor::TYPE_GROUP) {
    printer->Print(variables_,
                   "$type$ m =\n"
                   "    input.readGroup($number$,\n"
                   "        $type$.$get_parser$,\n"
                   "        extensionRegistry);\n");
  } else {
    printer->Print(variables_,
                   "$type$ m =\n"
                   "    input.readMessage(\n"
                   "        $type$.$get_parser$,\n"
                   "        extensionRegistry);\n");
  }
  PrintNestedBuilderCondition(printer,
                              "ensure$capitalized_name$IsMutable();\n"
                              "$name$_.add(m);\n",
                              "$name$Builder_.addMessage(m);\n");
}